

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

bool __thiscall
GraphPropagator::coherence_innodes
          (GraphPropagator *this,int edge,vector<int,_std::allocator<int>_> *added_n)

{
  char cVar1;
  pointer pvVar2;
  iterator __position;
  bool bVar3;
  undefined4 uVar4;
  BoolView *pBVar5;
  ulong uVar6;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  ulong uVar7;
  uint uVar8;
  pointer piVar9;
  size_t __size;
  int u;
  Clause *expl;
  uint local_4c;
  anon_union_8_2_743a5d44_for_Reason_0 local_48;
  void *pvStack_40;
  Clause *local_38;
  
  pvVar2 = (this->endnodes).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar9 = pvVar2[edge].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar2[edge].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + 8) != piVar9) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      local_4c = piVar9[uVar6];
      uVar6 = (ulong)local_4c;
      pBVar5 = (this->vs).data;
      uVar8 = pBVar5[uVar6].v;
      cVar1 = sat.assigns.data[uVar8];
      if (cVar1 == '\0') {
        if (so.lazy == true) {
          local_48._pt = (Clause *)malloc(0x10);
          *(uint *)local_48._pt = 0x202;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_48._pt);
          if (*(uint *)local_48._pt < 0x200) {
            abort();
          }
          uVar8 = (this->es).data[(uint)edge].v;
          *(uint *)(local_48._a + 8) =
               (uint)((int)sat.assigns.data[uVar8] - 1U < 0xfffffffd) + uVar8 * 2;
          uVar6 = (ulong)local_4c;
          pBVar5 = (this->vs).data;
          uVar8 = pBVar5[uVar6].v;
          r = local_48;
        }
        else {
          r._pt = (Clause *)0x0;
        }
        SAT::enqueue(&sat,(Lit)((uint)pBVar5[uVar6].s + uVar8 * 2),(Reason)r);
        __position._M_current =
             (added_n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (added_n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)added_n,__position,(int *)&local_4c);
        }
        else {
          *__position._M_current = local_4c;
          (added_n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
      }
      else if ((short)(char)((int)cVar1 + (((int)(short)cVar1 + 1U & 0xffff) >> 0xf) + 1 >> 1) ==
               (ushort)pBVar5[uVar6].s) {
        if (so.lazy == true) {
          local_48._pt = (Clause *)0x0;
          pvStack_40 = (void *)0x0;
          uVar8 = (this->es).data[(uint)edge].v;
          local_38._0_4_ = (uint)((int)sat.assigns.data[uVar8] - 1U < 0xfffffffd) + uVar8 * 2;
          vec<Lit>::push((vec<Lit> *)&local_48,(Lit *)&local_38);
          uVar8 = (this->vs).data[local_4c].v;
          local_38 = (Clause *)
                     CONCAT44(local_38._4_4_,
                              (uint)((int)sat.assigns.data[uVar8] - 1U < 0xfffffffd) + uVar8 * 2);
          vec<Lit>::push((vec<Lit> *)&local_48,(Lit *)&local_38);
          uVar4 = local_48._a._0_4_;
          uVar6 = local_48._a & 0xffffffff;
          __size = 8;
          if (local_48._a._0_4_ != 0) {
            __size = (ulong)(local_48._a._0_4_ - 1) * 4 + 8;
          }
          local_38 = (Clause *)malloc(__size);
          local_38->data[0].x = -2;
          if (uVar4 != 0) {
            uVar7 = 0;
            do {
              local_38->data[uVar7].x = *(int *)((long)pvStack_40 + uVar7 * 4);
              uVar7 = uVar7 + 1;
            } while (uVar6 != uVar7);
          }
          *(uint *)local_38 = uVar4 << 8 | 2;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
          sat.confl = local_38;
          if (pvStack_40 != (void *)0x0) {
            free(pvStack_40);
          }
        }
        return false;
      }
      pvVar2 = (this->endnodes).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar9 = pvVar2[edge].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar3 = uVar7 < (ulong)((long)*(pointer *)
                                     ((long)&pvVar2[edge].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data + 8) - (long)piVar9 >> 2);
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar3);
  }
  return true;
}

Assistant:

bool GraphPropagator::coherence_innodes(int edge, std::vector<node_id>& added_n) {
	for (unsigned int i = 0; i < endnodes[edge].size(); i++) {
		const int u = endnodes[edge][i];
		if (vs[u].isFixed() && vs[u].getVal() == 0) {
			if (so.lazy) {
				vec<Lit> ps;
				ps.push(es[edge].getValLit());
				ps.push(vs[u].getValLit());
				Clause* expl = Clause_new(ps);
				expl->temp_expl = 1;
				sat.rtrail.last().push(expl);
				sat.confl = expl;
			}
			return false;
		}
		if (!vs[u].isFixed()) {
			Clause* r = nullptr;
			if (so.lazy) {
				r = Reason_new(2);
				(*r)[1] = es[edge].getValLit();
			}
			if (GRAPHPROP_DEBUG) {
				std::cout << "COHERENCE (N) " << u << '\n';
			}
			vs[u].setVal2(true, r);
			added_n.push_back(u);
		}
	}
	return true;
}